

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void __thiscall OjaNewton::update_K(OjaNewton *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int j;
  int i;
  float tmp;
  OjaNewton *this_local;
  
  fVar1 = (this->data).norm2_x;
  fVar2 = (this->data).sketch_cnt;
  fVar3 = (this->data).sketch_cnt;
  for (i = 1; i <= this->m; i = i + 1) {
    for (j = 1; j <= this->m; j = j + 1) {
      this->K[i][j] =
           (this->data).delta[i] * (this->data).Zx[j] * (this->data).sketch_cnt + this->K[i][j];
      this->K[i][j] =
           (this->data).delta[j] * (this->data).Zx[i] * (this->data).sketch_cnt + this->K[i][j];
      this->K[i][j] =
           (this->data).delta[i] * (this->data).delta[j] * fVar1 * fVar2 * fVar3 + this->K[i][j];
    }
  }
  return;
}

Assistant:

void update_K()
  {
    float tmp = data.norm2_x * data.sketch_cnt * data.sketch_cnt;
    for (int i = 1; i <= m; i++)
    {
      for (int j = 1; j <= m; j++)
      {
        K[i][j] += data.delta[i] * data.Zx[j] * data.sketch_cnt;
        K[i][j] += data.delta[j] * data.Zx[i] * data.sketch_cnt;
        K[i][j] += data.delta[i] * data.delta[j] * tmp;
      }
    }
  }